

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CurrentSchemasBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  long lVar1;
  char cVar2;
  reference pvVar3;
  pointer pEVar4;
  type pEVar5;
  long lVar6;
  pointer pCVar7;
  undefined8 *puVar8;
  BinderException *this_00;
  NotImplementedException *this_01;
  vector<duckdb::Value,_true> schema_list;
  Value result_val;
  Value schema_value;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_158;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [48];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_f8;
  LogicalType local_e0 [24];
  LogicalType local_c8 [24];
  Value local_b0 [64];
  ClientContext local_70 [24];
  char local_58;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if (pEVar4[0x38] != (Expression)0xa) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"current_schemas requires a boolean input","");
    duckdb::BinderException::BinderException(this_00,(string *)local_138);
    __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  cVar2 = (**(code **)(*(long *)pEVar4 + 0x78))(pEVar4);
  if (cVar2 != '\0') {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
    duckdb::ExpressionExecutor::EvaluateScalar(local_70,(Expression *)context,SUB81(pEVar5,0));
    duckdb::LogicalType::LogicalType(local_c8,SQLNULL);
    duckdb::Value::Value(local_b0,local_c8);
    duckdb::LogicalType::~LogicalType(local_c8);
    if (local_58 == '\x01') {
      duckdb::LogicalType::LogicalType((LogicalType *)local_178,VARCHAR);
      duckdb::LogicalType::LIST(local_e0);
      duckdb::Value::Value((Value *)local_138,local_e0);
      duckdb::Value::operator=(local_b0,(Value *)local_138);
      duckdb::Value::~Value((Value *)local_138);
      duckdb::LogicalType::~LogicalType(local_e0);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_178);
    }
    else {
      cVar2 = duckdb::BooleanValue::Get((Value *)local_70);
      local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = duckdb::ClientData::Get(context);
      local_140._M_head_impl = (FunctionData *)this;
      if (cVar2 == '\0') {
        pCVar7 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                 ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                               *)(lVar6 + 0x78));
        pCVar7 = pCVar7 + 0x20;
      }
      else {
        unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
        ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)(lVar6 + 0x78));
        pCVar7 = (pointer)duckdb::CatalogSearchPath::Get();
      }
      lVar6 = *(long *)pCVar7;
      lVar1 = *(long *)(pCVar7 + 8);
      if (lVar6 != lVar1) {
        do {
          local_178[0] = local_168;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_178,*(long *)(lVar6 + 0x20),
                     *(long *)(lVar6 + 0x28) + *(long *)(lVar6 + 0x20));
          duckdb::Value::Value((Value *)local_138,local_178);
          if (local_178[0] != local_168) {
            operator_delete(local_178[0]);
          }
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (&local_158,(Value *)local_138);
          duckdb::Value::~Value((Value *)local_138);
          lVar6 = lVar6 + 0x40;
        } while (lVar6 != lVar1);
      }
      duckdb::LogicalType::LogicalType((LogicalType *)local_178,VARCHAR);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_f8,&local_158);
      this = (duckdb *)local_140._M_head_impl;
      duckdb::Value::LIST(local_138,local_178,&local_f8);
      duckdb::Value::operator=(local_b0,(Value *)local_138);
      duckdb::Value::~Value((Value *)local_138);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_f8);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_178);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_158);
    }
    puVar8 = (undefined8 *)operator_new(0x48);
    duckdb::Value::Value((Value *)local_138,local_b0);
    *puVar8 = &PTR__CurrentSchemasBindData_00898ae0;
    duckdb::Value::Value((Value *)(puVar8 + 1),(Value *)local_138);
    duckdb::Value::~Value((Value *)local_138);
    *(undefined8 **)this = puVar8;
    duckdb::Value::~Value(local_b0);
    duckdb::Value::~Value((Value *)local_70);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,"current_schemas requires a constant input","");
  duckdb::NotImplementedException::NotImplementedException(this_01,(string *)local_138);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> CurrentSchemasBind(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->return_type.id() != LogicalTypeId::BOOLEAN) {
		throw BinderException("current_schemas requires a boolean input");
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException("current_schemas requires a constant input");
	}
	Value schema_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	Value result_val;
	if (schema_value.IsNull()) {
		// null
		result_val = Value(LogicalType::LIST(LogicalType::VARCHAR));
	} else {
		auto implicit_schemas = BooleanValue::Get(schema_value);
		vector<Value> schema_list;
		auto &catalog_search_path = ClientData::Get(context).catalog_search_path;
		auto &search_path = implicit_schemas ? catalog_search_path->Get() : catalog_search_path->GetSetPaths();
		std::transform(search_path.begin(), search_path.end(), std::back_inserter(schema_list),
		               [](const CatalogSearchEntry &s) -> Value { return Value(s.schema); });
		result_val = Value::LIST(LogicalType::VARCHAR, schema_list);
	}
	return make_uniq<CurrentSchemasBindData>(std::move(result_val));
}